

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsort.c
# Opt level: O1

sexp_conflict
sexp_sort_x(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict seq,sexp_conflict less,
           sexp_conflict key)

{
  sexp_uint_t sVar1;
  long lVar2;
  sexp_conflict psVar3;
  sexp *ppsVar4;
  uint uVar5;
  sexp psVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  sexp_conflict vec;
  sexp_conflict scratch;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict local_58;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_58 = (sexp_conflict)0x43e;
  local_50 = (sexp_conflict)0x43e;
  if (seq == (sexp_conflict)&DAT_0000023e) {
    return seq;
  }
  if ((sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[2].prev == seq) {
    return seq;
  }
  local_48.var = &local_58;
  local_38.next = &local_48;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  local_38.var = &local_50;
  (ctx->value).context.saves = &local_38;
  lVar2 = sexp_listp_op(ctx,0,1,seq);
  psVar3 = seq;
  if (lVar2 != 0x3e) {
    psVar3 = (sexp_conflict)sexp_list_to_vector_op(ctx,0,1,seq);
  }
  local_58 = psVar3;
  if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 10)) {
    local_50 = (sexp_conflict)
               sexp_make_vector_op(ctx,0,2,(psVar3->value).stack.length * 2 + 1,0x43e);
    sVar1 = (local_58->value).stack.length;
    if ((key == (sexp_conflict)0x3e) &&
       ((less == (sexp_conflict)0x3e ||
        (((((ulong)less & 3) == 0 && (less->tag == 0x1b)) &&
         ((less->value).flonum_bits[0x58] == '\x05')))))) {
      sexp_merge_sort(ctx,&(local_58->value).type.cpl,&(local_50->value).type.cpl,0,sVar1 - 1);
      psVar3 = local_58;
      if ((((((ulong)less & 3) == 0) && (less->tag == 0x1b)) &&
          ((less->value).flonum_bits[0x5c] != '\0')) &&
         (uVar5 = *(int *)&local_58->value - 1, 0 < (int)uVar5)) {
        lVar2 = 0;
        uVar8 = (ulong)uVar5;
        do {
          uVar7 = uVar8 - 1;
          uVar9 = *(undefined8 *)((long)&local_58->value + lVar2 * 8 + 8);
          *(undefined8 *)((long)&local_58->value + lVar2 * 8 + 8) =
               *(undefined8 *)((long)&local_58->value + uVar8 * 8 + 8);
          *(undefined8 *)((long)&local_58->value + uVar8 * 8 + 8) = uVar9;
          lVar2 = lVar2 + 1;
          uVar8 = uVar7;
        } while (lVar2 < (long)uVar7);
      }
      goto LAB_00101b95;
    }
    if ((((ulong)less & 3) == 0) && ((less->tag == 0x14 || (less->tag == 0x1b)))) {
      if (((ulong)key & 3) == 0) {
        if (((key == (sexp_conflict)0x3e) || (key->tag == 0x14)) || (key->tag == 0x1b))
        goto LAB_00101cc8;
      }
      else if (key == (sexp_conflict)0x3e) {
LAB_00101cc8:
        psVar3 = sexp_merge_sort_less
                           (ctx,&(local_58->value).type.cpl,&(local_50->value).type.cpl,0,sVar1 - 1,
                            less,key);
        if ((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 0x13)) {
          psVar3 = local_50;
        }
        goto LAB_00101b95;
      }
      uVar9 = 0x14;
      psVar3 = key;
    }
    else {
      uVar9 = 0x14;
      psVar3 = less;
    }
  }
  else {
    uVar9 = 10;
  }
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,uVar9,psVar3);
LAB_00101b95:
  if (((((ulong)seq & 3) == 0) && (seq->tag == 6)) &&
     ((((ulong)psVar3 & 3) != 0 || (psVar3->tag != 0x13)))) {
    ppsVar4 = &(local_58->value).type.cpl;
    psVar6 = seq;
    do {
      psVar3 = seq;
      if (psVar6->tag != 6) break;
      (psVar6->value).flonum = (double)*ppsVar4;
      psVar6 = (psVar6->value).type.cpl;
      ppsVar4 = ppsVar4 + 1;
    } while (((ulong)psVar6 & 3) == 0);
  }
  (ctx->value).context.saves = local_48.next;
  return psVar3;
}

Assistant:

sexp sexp_sort_x (sexp ctx, sexp self, sexp_sint_t n, sexp seq,
                         sexp less, sexp key) {
  sexp_sint_t len;
  sexp res;
  sexp_gc_var2(vec, scratch);

  if (sexp_nullp(seq) || seq == sexp_global(ctx, SEXP_G_EMPTY_VECTOR))
    return seq;

  sexp_gc_preserve2(ctx, vec, scratch);

  vec = (sexp_truep(sexp_listp(ctx, seq)) ? sexp_list_to_vector(ctx, seq) : seq);

  if (! sexp_vectorp(vec)) {
    res = sexp_type_exception(ctx, self, SEXP_VECTOR, vec);
  } else {
    scratch = sexp_make_vector(ctx, sexp_make_fixnum(sexp_vector_length(vec)), SEXP_VOID);
    len = sexp_vector_length(vec);
    if (sexp_not(key) && sexp_basic_comparator(less)) {
      sexp_merge_sort(ctx, sexp_vector_data(vec), sexp_vector_data(scratch),
                      0, len-1);
      if (sexp_opcodep(less) && sexp_opcode_inverse(less))
        sexp_vector_nreverse(ctx, vec);
      res = vec;
    } else if (! (sexp_procedurep(less) || sexp_opcodep(less))) {
      res = sexp_type_exception(ctx, self, SEXP_PROCEDURE, less);
    } else if (! (sexp_procedurep(key) || sexp_opcodep(key) || sexp_not(key))) {
      res = sexp_type_exception(ctx, self, SEXP_PROCEDURE, key);
    } else {
      res = sexp_merge_sort_less(ctx, sexp_vector_data(vec),
                                 sexp_vector_data(scratch),
                                 0, len-1, less, key);
      if (!sexp_exceptionp(res))
        res = scratch;
    }
  }

  if (sexp_pairp(seq) && ! sexp_exceptionp(res))
    res = sexp_vector_copy_to_list(ctx, vec, seq);

  sexp_gc_release2(ctx);
  return res;
}